

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::setReasonStrategy(DefaultUnfoundedCheck *this,ReasonStrategy rs)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint32 uVar3;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  ulong uVar4;
  ulong *puVar5;
  undefined4 in_ESI;
  long in_RDI;
  ulong uVar6;
  ulong *local_48;
  
  *(undefined4 *)(in_RDI + 0xf4) = in_ESI;
  if (((*(int *)(in_RDI + 0xf4) == 1) && (*(long *)(in_RDI + 0x10) != 0)) &&
     (*(long *)(in_RDI + 0xe8) == 0)) {
    uVar3 = Solver::numVars((Solver *)0x20de1f);
    this_00 = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)CONCAT44(0,uVar3);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this_00;
    uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6);
    *puVar5 = (ulong)this_00;
    puVar5 = puVar5 + 1;
    if (this_00 != (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0) {
      lVar2 = (long)this_00 * 2;
      local_48 = puVar5;
      do {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector(this_00);
        local_48 = local_48 + 2;
      } while (local_48 != puVar5 + lVar2);
    }
    *(ulong **)(in_RDI + 0xe8) = puVar5;
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::setReasonStrategy(ReasonStrategy rs) {
	strategy_ = rs;
	if (strategy_ == only_reason && solver_ && !reasons_) {
		reasons_ = new LitVec[solver_->numVars()];
	}
}